

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGeneratorObjectStrings::cmMakefileTargetGeneratorObjectStrings
          (cmMakefileTargetGeneratorObjectStrings *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *strings,cmOutputConverter *outputConverter,cmStateDirectory *stateDir,size_type limit)

{
  size_type limit_local;
  cmStateDirectory *stateDir_local;
  cmOutputConverter *outputConverter_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *strings_local;
  cmMakefileTargetGeneratorObjectStrings *this_local;
  
  this->Strings = strings;
  this->OutputConverter = outputConverter;
  memcpy(&this->StateDir,stateDir,0x28);
  this->LengthLimit = limit;
  std::__cxx11::string::string((string *)&this->CurrentString);
  std::__cxx11::string::string((string *)&this->NextObject);
  this->Space = "";
  return;
}

Assistant:

cmMakefileTargetGeneratorObjectStrings(std::vector<std::string>& strings,
                                         cmOutputConverter* outputConverter,
                                         cmStateDirectory const& stateDir,
                                         std::string::size_type limit)
    : Strings(strings)
    , OutputConverter(outputConverter)
    , StateDir(stateDir)
    , LengthLimit(limit)
  {
    this->Space = "";
  }